

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_bdecode.cpp
# Opt level: O1

int __thiscall libtorrent::lazy_entry::capacity(lazy_entry *this)

{
  if ((this->m_data).dict != (lazy_dict_entry *)0x0) {
    return *(int *)(&(((this->m_data).dict)->val).m_begin +
                   ((*(uint *)&this->field_0x14 & 0xe0000000) == 0x20000000));
  }
  return 0;
}

Assistant:

int lazy_entry::capacity() const
	{
		TORRENT_ASSERT(m_type == dict_t || m_type == list_t);
		if (m_data.list == nullptr) return 0;
		if (m_type == dict_t)
			return int(m_data.dict[0].val.m_len);
		else
			return int(m_data.list[0].m_len);
	}